

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_2_5::CompositeDeepScanLine::Data::handleDeepFrameBuffer
          (Data *this,DeepFrameBuffer *buf,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *counts,
          vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
          *pointers,Header *header,int start,int end)

{
  size_t yst;
  long lVar1;
  iterator iVar2;
  Iterator IVar3;
  long lVar4;
  long lVar5;
  size_type __new_size;
  undefined1 in_R10B;
  ConstIterator tmp;
  Slice local_68;
  
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)&local_68);
  lVar1 = (long)(int)local_68.type;
  __new_size = (long)((end - start) + 1) * (lVar1 + 1);
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::resize(pointers,(long)(this->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(counts,__new_size);
  lVar5 = (long)start * (lVar1 + 1);
  Slice::Slice(&local_68,UINT,
               (char *)((counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start +
                       (-(long)(this->_dataWindow).min.x - lVar5)),4,lVar1 * 4 + 4,1,1,0.0,
               (bool)in_R10B,true);
  DeepFrameBuffer::insertSampleCountSlice(buf,&local_68);
  std::vector<float_*,_std::allocator<float_*>_>::resize
            ((pointers->
             super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,__new_size);
  yst = lVar1 * 8 + 8;
  DeepSlice::DeepSlice
            ((DeepSlice *)&local_68,FLOAT,
             (char *)(*(long *)&(((pointers->
                                  super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                                super__Vector_impl_data + (long)(this->_dataWindow).min.x * -8 +
                     lVar5 * -8),8,yst,4,1,1,0.0,false,false);
  DeepFrameBuffer::insert(buf,"Z",(DeepSlice *)&local_68);
  if (this->_zback == true) {
    std::vector<float_*,_std::allocator<float_*>_>::resize
              ((pointers->
               super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,__new_size);
    DeepSlice::DeepSlice
              ((DeepSlice *)&local_68,FLOAT,
               (char *)(*(long *)&(pointers->
                                  super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                  super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                  super__Vector_impl_data + (long)(this->_dataWindow).min.x * -8 +
                       lVar5 * -8),8,yst,4,1,1,0.0,false,false);
    DeepFrameBuffer::insert(buf,"ZBack",(DeepSlice *)&local_68);
  }
  std::vector<float_*,_std::allocator<float_*>_>::resize
            ((pointers->
             super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,__new_size);
  DeepSlice::DeepSlice
            ((DeepSlice *)&local_68,FLOAT,
             (char *)(*(long *)&(pointers->
                                super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[2].
                                super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                super__Vector_impl_data + (long)(this->_dataWindow).min.x * -8 +
                     lVar5 * -8),8,yst,4,1,1,0.0,false,false);
  DeepFrameBuffer::insert(buf,"A",(DeepSlice *)&local_68);
  iVar2._M_node = (_Base_ptr)FrameBuffer::begin(&this->_outputFrameBuffer);
  lVar1 = 0;
  while( true ) {
    IVar3 = FrameBuffer::end(&this->_outputFrameBuffer);
    if ((iterator)iVar2._M_node == IVar3._i._M_node) break;
    lVar4 = (long)*(int *)((long)(this->_bufferMap).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar1);
    if (2 < lVar4) {
      std::vector<float_*,_std::allocator<float_*>_>::resize
                ((pointers->
                 super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar4,__new_size);
      DeepSlice::DeepSlice
                ((DeepSlice *)&local_68,FLOAT,
                 (char *)(*(long *)&(pointers->
                                    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar4].
                                    super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                    super__Vector_impl_data + (long)(this->_dataWindow).min.x * -8 +
                         lVar5 * -8),8,yst,4,1,1,0.0,false,false);
      DeepFrameBuffer::insert(buf,(char *)(iVar2._M_node + 1),(DeepSlice *)&local_68);
    }
    iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    lVar1 = lVar1 + 4;
  }
  return;
}

Assistant:

void 
CompositeDeepScanLine::Data::handleDeepFrameBuffer (DeepFrameBuffer& buf,
                                                    std::vector< unsigned int > & counts,
                                                    vector< std::vector< float* > > & pointers,
                                                    const Header& header,
                                                    int start,
                                                    int end)
{
    ptrdiff_t width=_dataWindow.size().x+1;
    size_t pixelcount = width * (end-start+1);
    pointers.resize(_channels.size());
    counts.resize(pixelcount);
    buf.insertSampleCountSlice (Slice (OPENEXR_IMF_INTERNAL_NAMESPACE::UINT,
                                (char *) (&counts[0]-_dataWindow.min.x-start*width),
                                sizeof(unsigned int),
                                sizeof(unsigned int)*width));

    pointers[0].resize(pixelcount);
    buf.insert ("Z", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                (char *)(&pointers[0][0]-_dataWindow.min.x-start*width),
                                sizeof(float *),
                                sizeof(float *)*width,
                                sizeof(float) ));

    if(_zback)
    {
        pointers[1].resize(pixelcount);
        buf.insert ("ZBack", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                        (char *)(&pointers[1][0]-_dataWindow.min.x-start*width),
                                        sizeof(float *),
                                        sizeof(float *)*width,
                                        sizeof(float) ));
    }

    pointers[2].resize(pixelcount);
    buf.insert ("A", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                (char *)(&pointers[2][0]-_dataWindow.min.x-start*width),
                                sizeof(float *),
                                sizeof(float *)*width,
                                sizeof(float) ));


    size_t i =0;
    for(FrameBuffer::ConstIterator qt  = _outputFrameBuffer.begin();
                                   qt != _outputFrameBuffer.end();
                                   qt++)
    {
        int channel_in_source = _bufferMap[i];
        if(channel_in_source>2)
        {
            // not dealt with yet (0,1,2 previously inserted)
            pointers[channel_in_source].resize(pixelcount);
            buf.insert (qt.name(),
                        DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                   (char *)(&pointers[channel_in_source][0]-_dataWindow.min.x-start*width),
                                   sizeof(float *),
                                   sizeof(float *)*width,
                                   sizeof(float) ));
        }

        i++;
    }

}